

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wstring * intToString_abi_cxx11_(uint value,int digits)

{
  uint in_EDX;
  undefined4 in_register_0000003c;
  wstring *this;
  wchar_t local_58 [2];
  wchar_t buf [9];
  uint local_18;
  int digits_local;
  uint value_local;
  wstring *result;
  
  this = (wstring *)CONCAT44(in_register_0000003c,value);
  std::__cxx11::wstring::wstring(this);
  std::__cxx11::wstring::reserve((ulong)this);
  for (local_18 = in_EDX; 8 < (int)local_18; local_18 = local_18 - 1) {
    std::__cxx11::wstring::operator+=(this,L' ');
  }
  swprintf(local_58,9,L"%*d",(ulong)local_18,(ulong)(uint)digits);
  std::__cxx11::wstring::operator+=(this,local_58);
  return this;
}

Assistant:

std::wstring intToString(unsigned int value, int digits)
{
	std::wstring result;
	result.reserve(digits);

	while (digits > 8)
	{
		result += ' ';
		digits--;
	}
	
	wchar_t buf[9];
	swprintf(buf,9,L"%*d",digits,value);
	result += buf;

	return result;
}